

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssp_blas2.c
# Opt level: O0

int sp_strsv(char *uplo,char *trans,char *diag,SuperMatrix *L,SuperMatrix *U,float *x,
            SuperLUStat_t *stat,int *info)

{
  int iVar1;
  char local_1b8 [8];
  char msg [256];
  int local_b0;
  float local_ac;
  int ii;
  flops_t solve_ops;
  float *work;
  int local_98;
  int_t iptr;
  int_t k;
  int_t i;
  int_t istart;
  int_t luptr;
  int nsupc;
  int nsupr;
  int fsupc;
  int jcol;
  int irow;
  int nrow;
  float beta;
  float alpha;
  int incy;
  int incx;
  float *Uval;
  float *Lval;
  NCformat *Ustore;
  SCformat *Lstore;
  float *x_local;
  SuperMatrix *U_local;
  SuperMatrix *L_local;
  char *diag_local;
  char *trans_local;
  char *uplo_local;
  
  alpha = 1.4013e-45;
  beta = 1.4013e-45;
  nrow = 0x3f800000;
  irow = 0x3f800000;
  *info = 0;
  Lstore = (SCformat *)x;
  x_local = (float *)U;
  U_local = L;
  L_local = (SuperMatrix *)diag;
  diag_local = trans;
  trans_local = uplo;
  iVar1 = strncmp(uplo,"L",1);
  if ((iVar1 == 0) || (iVar1 = strncmp(trans_local,"U",1), iVar1 == 0)) {
    iVar1 = strncmp(diag_local,"N",1);
    if ((iVar1 == 0) ||
       ((iVar1 = strncmp(diag_local,"T",1), iVar1 == 0 ||
        (iVar1 = strncmp(diag_local,"C",1), iVar1 == 0)))) {
      iVar1 = strncmp((char *)L_local,"U",1);
      if ((iVar1 == 0) || (iVar1 = strncmp((char *)L_local,"N",1), iVar1 == 0)) {
        if ((U_local->nrow == U_local->ncol) && (-1 < U_local->nrow)) {
          if ((x_local[3] != x_local[4]) || ((int)x_local[3] < 0)) {
            *info = -5;
          }
        }
        else {
          *info = -4;
        }
      }
      else {
        *info = -3;
      }
    }
    else {
      *info = -2;
    }
  }
  else {
    *info = -1;
  }
  if (*info == 0) {
    Ustore = (NCformat *)U_local->Store;
    Uval = (float *)Ustore->nzval;
    Lval = *(float **)(x_local + 6);
    _incy = *(long *)(Lval + 2);
    local_ac = 0.0;
    _ii = floatCalloc((long)U_local->nrow);
    if (_ii == (float *)0x0) {
      sprintf(local_1b8,"%s at line %d in file %s\n","Malloc fails for work in sp_strsv().",0x7f,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/ssp_blas2.c"
             );
      superlu_abort_and_exit(local_1b8);
    }
    iVar1 = strncmp(diag_local,"N",1);
    if (iVar1 == 0) {
      iVar1 = strncmp(trans_local,"L",1);
      if (iVar1 == 0) {
        if (U_local->nrow == 0) {
          return 0;
        }
        for (local_98 = 0; local_98 <= *(int *)&Ustore->field_0x4; local_98 = local_98 + 1) {
          nsupc = Ustore[1].rowind[local_98];
          k = *(int *)(*(long *)(Ustore + 1) + (long)nsupc * 4);
          luptr = *(int *)(*(long *)(Ustore + 1) + (long)(nsupc + 1) * 4) - k;
          istart = Ustore[1].rowind[local_98 + 1] - nsupc;
          i = Ustore->rowind[nsupc];
          jcol = luptr - istart;
          local_ac = (float)(jcol * 2 * istart) + (float)(istart * (istart + -1)) + local_ac;
          iVar1 = k;
          if (istart == 1) {
            while (work._4_4_ = iVar1 + 1,
                  work._4_4_ < *(int *)(*(long *)(Ustore + 1) + (long)(nsupc + 1) * 4)) {
              fsupc = Ustore->colptr[work._4_4_];
              i = i + 1;
              (&Lstore->nnz)[fsupc] =
                   (int_t)(-(float)(&Lstore->nnz)[nsupc] * Uval[i] + (float)(&Lstore->nnz)[fsupc]);
              iVar1 = work._4_4_;
            }
          }
          else {
            slsolve(luptr,istart,Uval + i,(float *)(&Lstore->nnz + nsupc));
            smatvec(luptr,luptr - istart,istart,Uval + (i + istart),(float *)(&Lstore->nnz + nsupc),
                    _ii);
            work._4_4_ = k + istart;
            for (iptr = 0; iptr < jcol; iptr = iptr + 1) {
              fsupc = Ustore->colptr[work._4_4_];
              (&Lstore->nnz)[fsupc] = (int_t)((float)(&Lstore->nnz)[fsupc] - _ii[iptr]);
              _ii[iptr] = 0.0;
              work._4_4_ = work._4_4_ + 1;
            }
          }
        }
      }
      else {
        if (x_local[3] == 0.0) {
          return 0;
        }
        for (local_98 = *(int *)&Ustore->field_0x4; -1 < local_98; local_98 = local_98 + -1) {
          nsupc = Ustore[1].rowind[local_98];
          luptr = *(int *)(*(long *)(Ustore + 1) + (long)(nsupc + 1) * 4) -
                  *(int *)(*(long *)(Ustore + 1) + (long)nsupc * 4);
          istart = Ustore[1].rowind[local_98 + 1] - nsupc;
          i = Ustore->rowind[nsupc];
          local_ac = (float)(istart * (istart + 1)) + local_ac;
          if (istart == 1) {
            (&Lstore->nnz)[nsupc] = (int_t)((float)(&Lstore->nnz)[nsupc] / Uval[i]);
            for (iptr = *(int_t *)(*(long *)(Lval + 6) + (long)nsupc * 4);
                iptr < *(int *)(*(long *)(Lval + 6) + (long)(nsupc + 1) * 4); iptr = iptr + 1) {
              fsupc = *(int *)(*(long *)(Lval + 4) + (long)iptr * 4);
              (&Lstore->nnz)[fsupc] =
                   (int_t)(-(float)(&Lstore->nnz)[nsupc] * *(float *)(_incy + (long)iptr * 4) +
                          (float)(&Lstore->nnz)[fsupc]);
            }
          }
          else {
            susolve(luptr,istart,Uval + i,(float *)(&Lstore->nnz + nsupc));
            for (nsupr = nsupc; nsupr < Ustore[1].rowind[local_98 + 1]; nsupr = nsupr + 1) {
              local_ac = (float)((*(int *)(*(long *)(Lval + 6) + (long)(nsupr + 1) * 4) -
                                 *(int *)(*(long *)(Lval + 6) + (long)nsupr * 4)) * 2) + local_ac;
              for (iptr = *(int_t *)(*(long *)(Lval + 6) + (long)nsupr * 4);
                  iptr < *(int *)(*(long *)(Lval + 6) + (long)(nsupr + 1) * 4); iptr = iptr + 1) {
                fsupc = *(int *)(*(long *)(Lval + 4) + (long)iptr * 4);
                (&Lstore->nnz)[fsupc] =
                     (int_t)(-(float)(&Lstore->nnz)[nsupr] * *(float *)(_incy + (long)iptr * 4) +
                            (float)(&Lstore->nnz)[fsupc]);
              }
            }
          }
        }
      }
    }
    else {
      iVar1 = strncmp(trans_local,"L",1);
      if (iVar1 == 0) {
        if (U_local->nrow == 0) {
          return 0;
        }
        for (local_98 = *(int *)&Ustore->field_0x4; -1 < local_98; local_98 = local_98 + -1) {
          nsupc = Ustore[1].rowind[local_98];
          k = *(int *)(*(long *)(Ustore + 1) + (long)nsupc * 4);
          luptr = *(int *)(*(long *)(Ustore + 1) + (long)(nsupc + 1) * 4) - k;
          istart = Ustore[1].rowind[local_98 + 1] - nsupc;
          i = Ustore->rowind[nsupc];
          local_ac = (float)((luptr - istart) * 2 * istart) + local_ac;
          for (nsupr = nsupc; nsupr < Ustore[1].rowind[local_98 + 1]; nsupr = nsupr + 1) {
            work._4_4_ = k + istart;
            for (iptr = Ustore->rowind[nsupr] + istart; iptr < Ustore->rowind[nsupr + 1];
                iptr = iptr + 1) {
              fsupc = Ustore->colptr[work._4_4_];
              (&Lstore->nnz)[nsupr] =
                   (int_t)(-(float)(&Lstore->nnz)[fsupc] * Uval[iptr] + (float)(&Lstore->nnz)[nsupr]
                          );
              work._4_4_ = work._4_4_ + 1;
            }
          }
          if (1 < istart) {
            local_ac = (float)(istart * (istart + -1)) + local_ac;
            strsv_("L","T","U",&istart,Uval + i,&luptr,(real *)(&Lstore->nnz + nsupc),
                   (integer *)&alpha);
          }
        }
      }
      else {
        if (x_local[3] == 0.0) {
          return 0;
        }
        for (local_98 = 0; local_98 <= *(int *)&Ustore->field_0x4; local_98 = local_98 + 1) {
          nsupc = Ustore[1].rowind[local_98];
          luptr = *(int *)(*(long *)(Ustore + 1) + (long)(nsupc + 1) * 4) -
                  *(int *)(*(long *)(Ustore + 1) + (long)nsupc * 4);
          istart = Ustore[1].rowind[local_98 + 1] - nsupc;
          i = Ustore->rowind[nsupc];
          for (nsupr = nsupc; nsupr < Ustore[1].rowind[local_98 + 1]; nsupr = nsupr + 1) {
            local_ac = (float)((*(int *)(*(long *)(Lval + 6) + (long)(nsupr + 1) * 4) -
                               *(int *)(*(long *)(Lval + 6) + (long)nsupr * 4)) * 2) + local_ac;
            for (iptr = *(int_t *)(*(long *)(Lval + 6) + (long)nsupr * 4);
                iptr < *(int *)(*(long *)(Lval + 6) + (long)(nsupr + 1) * 4); iptr = iptr + 1) {
              fsupc = *(int *)(*(long *)(Lval + 4) + (long)iptr * 4);
              (&Lstore->nnz)[nsupr] =
                   (int_t)(-(float)(&Lstore->nnz)[fsupc] * *(float *)(_incy + (long)iptr * 4) +
                          (float)(&Lstore->nnz)[nsupr]);
            }
          }
          local_ac = (float)(istart * (istart + 1)) + local_ac;
          if (istart == 1) {
            (&Lstore->nnz)[nsupc] = (int_t)((float)(&Lstore->nnz)[nsupc] / Uval[i]);
          }
          else {
            strsv_("U","T","N",&istart,Uval + i,&luptr,(real *)(&Lstore->nnz + nsupc),
                   (integer *)&alpha);
          }
        }
      }
    }
    stat->ops[0x11] = local_ac + stat->ops[0x11];
    superlu_free(_ii);
    return 0;
  }
  local_b0 = -*info;
  input_error("sp_strsv",&local_b0);
  return 0;
}

Assistant:

int
sp_strsv(char *uplo, char *trans, char *diag, SuperMatrix *L, 
         SuperMatrix *U, float *x, SuperLUStat_t *stat, int *info)
{
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    SCformat *Lstore;
    NCformat *Ustore;
    float   *Lval, *Uval;
    int incx = 1, incy = 1;
    float alpha = 1.0, beta = 1.0;
    int nrow, irow, jcol;
    int fsupc, nsupr, nsupc;
    int_t luptr, istart, i, k, iptr;
    float *work;
    flops_t solve_ops;

    /* Test the input parameters */
    *info = 0;
    if ( strncmp(uplo,"L", 1)!=0 && strncmp(uplo, "U", 1)!=0 ) *info = -1;
    else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 && 
              strncmp(trans, "C", 1)!=0) *info = -2;
    else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 )
         *info = -3;
    else if ( L->nrow != L->ncol || L->nrow < 0 ) *info = -4;
    else if ( U->nrow != U->ncol || U->nrow < 0 ) *info = -5;
    if ( *info ) {
	int ii = -(*info);
	input_error("sp_strsv", &ii);
	return 0;
    }

    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;

    if ( !(work = floatCalloc(L->nrow)) )
	ABORT("Malloc fails for work in sp_strsv().");
    
    if ( strncmp(trans, "N", 1)==0 ) {	/* Form x := inv(A)*x. */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L)*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
		fsupc = L_FST_SUPC(k);
		istart = L_SUB_START(fsupc);
		nsupr = L_SUB_START(fsupc+1) - istart;
		nsupc = L_FST_SUPC(k+1) - fsupc;
		luptr = L_NZ_START(fsupc);
		nrow = nsupr - nsupc;

	        solve_ops += nsupc * (nsupc - 1);
	        solve_ops += 2 * nrow * nsupc;

		if ( nsupc == 1 ) {
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); ++iptr) {
			irow = L_SUB(iptr);
			++luptr;
			x[irow] -= x[fsupc] * Lval[luptr];
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    STRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    SGEMV(ftcs2, &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#else
		    strsv_("L", "N", "U", &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    sgemv_("N", &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#endif
#else
		    slsolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc]);
		
		    smatvec ( nsupr, nsupr-nsupc, nsupc, &Lval[luptr+nsupc],
                             &x[fsupc], &work[0] );
#endif		
		
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; ++i, ++iptr) {
			irow = L_SUB(iptr);
			x[irow] -= work[i];	/* Scatter */
			work[i] = 0.0;

		    }
	 	}
	    } /* for k ... */
	    
	} else {
	    /* Form x := inv(U)*x */
	    
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; k--) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);
		
    	        solve_ops += nsupc * (nsupc + 1);

		if ( nsupc == 1 ) {
		    x[fsupc] /= Lval[luptr];
		    for (i = U_NZ_START(fsupc); i < U_NZ_START(fsupc+1); ++i) {
			irow = U_SUB(i);
			x[irow] -= x[fsupc] * Uval[i];
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    STRSV(ftcs3, ftcs2, ftcs2, &nsupc, &Lval[luptr], &nsupr,
		       &x[fsupc], &incx);
#else
		    strsv_("U", "N", "N", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
#else		
		    susolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc] );
#endif		

		    for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		        solve_ops += 2*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    	for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); 
				i++) {
			    irow = U_SUB(i);
			    x[irow] -= x[jcol] * Uval[i];
		    	}
                    }
		}
	    } /* for k ... */
	    
	}
    } else { /* Form x := inv(A')*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L')*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 2 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
			x[jcol] -= x[irow] * Lval[i];
			iptr++;
		    }
		}
		
		if ( nsupc > 1 ) {
		    solve_ops += nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    STRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
		    strsv_("L", "T", "U", &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := inv(U')*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 2*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
			x[jcol] -= x[irow] * Uval[i];
		    }
		}

		solve_ops += nsupc * (nsupc + 1);

		if ( nsupc == 1 ) {
		    x[fsupc] /= Lval[luptr];
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    STRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
		    strsv_("U", "T", "N", &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#endif
		}
	    } /* for k ... */
	}
    }

    stat->ops[SOLVE] += solve_ops;
    SUPERLU_FREE(work);
    return 0;
}